

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

string * __thiscall
ot::commissioner::Interpreter::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,ChannelMask *aChannelMask)

{
  byte bVar1;
  uint __len;
  long *plVar2;
  long *plVar3;
  ByteArray *extraout_RDX;
  ByteArray *extraout_RDX_00;
  ByteArray *extraout_RDX_01;
  ByteArray *extraout_RDX_02;
  ByteArray *aBytes;
  pointer pbVar4;
  string __str;
  long *local_a8;
  long local_98;
  long lStack_90;
  string *local_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string local_58;
  pointer local_38;
  
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar4 = (this->mContext).mNwkAliases.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->mContext).mNwkAliases.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != local_38) {
    local_88 = __return_storage_ptr__;
    do {
      bVar1 = *(byte *)&(pbVar4->_M_dataplus)._M_p;
      __len = 3 - (bVar1 < 100);
      if (bVar1 < 10) {
        __len = 1;
      }
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_58,(char)__len);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_58._M_dataplus._M_p,__len,(uint)bVar1);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x2211af);
      __return_storage_ptr__ = local_88;
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_70 = *plVar3;
        lStack_68 = plVar2[3];
        local_80 = &local_70;
      }
      else {
        local_70 = *plVar3;
        local_80 = (long *)*plVar2;
      }
      local_78 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
      local_a8 = &local_98;
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_98 = *plVar3;
        lStack_90 = plVar2[3];
      }
      else {
        local_98 = *plVar3;
        local_a8 = (long *)*plVar2;
      }
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a8);
      aBytes = extraout_RDX;
      if (local_a8 != &local_98) {
        operator_delete(local_a8);
        aBytes = extraout_RDX_00;
      }
      if (local_80 != &local_70) {
        operator_delete(local_80);
        aBytes = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
        aBytes = extraout_RDX_02;
      }
      utils::Hex_abi_cxx11_(&local_58,(utils *)&pbVar4->_M_string_length,aBytes);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x2211be);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_70 = *plVar3;
        lStack_68 = plVar2[3];
        local_80 = &local_70;
      }
      else {
        local_70 = *plVar3;
        local_80 = (long *)*plVar2;
      }
      local_78 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
      local_a8 = &local_98;
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_98 = *plVar3;
        lStack_90 = plVar2[3];
      }
      else {
        local_98 = *plVar3;
        local_a8 = (long *)*plVar2;
      }
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a8);
      if (local_a8 != &local_98) {
        operator_delete(local_a8);
      }
      if (local_80 != &local_70) {
        operator_delete(local_80);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != local_38);
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::pop_back();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::ToString(const ChannelMask &aChannelMask)
{
    std::string ret;
    for (const auto &entry : aChannelMask)
    {
        ret += "page=" + std::to_string(entry.mPage) + "\n";
        ret += "masks=" + utils::Hex(entry.mMasks) + "\n";
    }
    if (!ret.empty())
    {
        ret.pop_back();
    }
    return ret;
}